

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O1

bool anon_unknown.dwarf_359a2::consume_bytes<unsigned_char>
               (uint8_t *stream,size_t len,uint8_t **pointer,uchar *destination)

{
  uchar *puVar1;
  
  if ((len != 0) && ((*pointer < stream || (stream + len <= *pointer)))) {
    __assert_fail("len == 0 || (pointer >= stream && pointer < stream + len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Xanewok[P]netacka-clone/protocol.cc"
                  ,0x2e,
                  "bool (anonymous namespace)::consume_bytes(const std::uint8_t *, size_t, const std::uint8_t *&, T &) [T = unsigned char]"
                 );
  }
  puVar1 = *pointer + 1;
  if (puVar1 <= stream + len) {
    *destination = **pointer;
    *pointer = *pointer + 1;
  }
  return puVar1 <= stream + len;
}

Assistant:

bool consume_bytes(const std::uint8_t* stream, size_t len, const std::uint8_t*& pointer, T& destination)
	{
		assert(len == 0 || (pointer >= stream && pointer < stream + len));
		// Not enough data in the stream
		if (pointer + sizeof(T) > stream + len)
			return false;

		destination = ntoh(*reinterpret_cast<const T*>(pointer));
		pointer += sizeof(T);
		return true;
	}